

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall fmt::internal::ThousandsSep::operator()(ThousandsSep *this,char **buffer)

{
  uint uVar1;
  size_t sVar2;
  char *__first;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  char **buffer_local;
  ThousandsSep *this_local;
  
  uVar1 = this->digit_index_ + 1;
  this->digit_index_ = uVar1;
  if (uVar1 % 3 == 0) {
    sVar2 = BasicStringRef<char>::size(&this->sep_);
    *buffer = *buffer + -sVar2;
    __first = BasicStringRef<char>::data(&this->sep_);
    pcVar3 = BasicStringRef<char>::data(&this->sep_);
    sVar2 = BasicStringRef<char>::size(&this->sep_);
    pcVar5 = *buffer;
    sVar4 = BasicStringRef<char>::size(&this->sep_);
    pcVar5 = make_ptr<char>(pcVar5,sVar4);
    std::uninitialized_copy<char_const*,char*>(__first,pcVar3 + sVar2,pcVar5);
  }
  return;
}

Assistant:

void operator()(Char *&buffer) {
    if (++digit_index_ % 3 != 0)
      return;
    buffer -= sep_.size();
    std::uninitialized_copy(sep_.data(), sep_.data() + sep_.size(),
                            internal::make_ptr(buffer, sep_.size()));
  }